

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_scalingFactorSelfReferencingUnits1_Test::TestBody
          (Units_scalingFactorSelfReferencingUnits1_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertHelper local_1f0 [8];
  Message local_1e8 [8];
  double local_1e0;
  double local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_1;
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [32];
  AssertHelper local_170 [8];
  Message local_168 [8];
  double local_160;
  double local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [32];
  undefined1 local_a0 [8];
  UnitsPtr mX;
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  UnitsPtr X;
  ModelPtr model;
  Units_scalingFactorSelfReferencingUnits1_Test *this_local;
  
  libcellml::Model::create();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"X",&local_51);
  libcellml::Units::create((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"mole",
             (allocator<char> *)
             ((long)&mX.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar2);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&mX.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"mX",&local_c1);
  libcellml::Units::create((string *)local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"X",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_110,"milli",&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::Units::addUnit((string *)peVar2,local_e8,1.0,1.0,local_110);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&X.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Model::addUnits((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&X.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Model::addUnits((shared_ptr *)peVar3);
  local_158 = 1000.0;
  local_160 = (double)libcellml::Units::scalingFactor
                                ((shared_ptr *)local_a0,(shared_ptr *)local_30,true);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_150,"1000.0","libcellml::Units::scalingFactor(mX, X)",
             &local_158,&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(local_168);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x9d9,pcVar4);
    testing::internal::AssertHelper::operator=(local_170,local_168);
    testing::internal::AssertHelper::~AssertHelper(local_170);
    testing::Message::~Message(local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"litre",&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,"",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  libcellml::Units::addUnit((string *)peVar2,-1.0,local_190);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  local_1d8 = 1000.0;
  local_1e0 = (double)libcellml::Units::scalingFactor
                                ((shared_ptr *)local_a0,(shared_ptr *)local_30,true);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_1d0,"1000.0","libcellml::Units::scalingFactor(mX, X)",
             &local_1d8,&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(local_1e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              (local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x9dd,pcVar4);
    testing::internal::AssertHelper::operator=(local_1f0,local_1e8);
    testing::internal::AssertHelper::~AssertHelper(local_1f0);
    testing::Message::~Message(local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_a0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_30);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &X.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, scalingFactorSelfReferencingUnits1)
{
    auto model = libcellml::Model::create();
    auto X = libcellml::Units::create("X");
    X->addUnit("mole");
    auto mX = libcellml::Units::create("mX");
    mX->addUnit("X", "milli");
    model->addUnits(X);
    model->addUnits(mX);

    EXPECT_EQ(1000.0, libcellml::Units::scalingFactor(mX, X));

    X->addUnit("litre", -1.0);

    EXPECT_EQ(1000.0, libcellml::Units::scalingFactor(mX, X));
}